

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

bool clip_image_load_from_file(char *fname,clip_image_u8 *img)

{
  pointer __dest;
  stbi_uc *__src;
  int ny;
  int nx;
  int nc;
  int local_24;
  int local_20;
  int local_1c;
  
  __src = stbi_load(fname,&local_20,&local_24,&local_1c,3);
  if (__src == (stbi_uc *)0x0) {
    if ((int)g_logger_state.verbosity_thold < 5) {
      clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to load image \'%s\'\n",
                        "clip_image_load_from_file",fname);
    }
  }
  else {
    img->nx = local_20;
    img->ny = local_24;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&img->buf,(long)(local_20 * local_24 * 3));
    __dest = (img->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy(__dest,__src,
           (long)(img->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)__dest);
    free(__src);
  }
  return __src != (stbi_uc *)0x0;
}

Assistant:

bool clip_image_load_from_file(const char * fname, clip_image_u8 * img) {
    int nx, ny, nc;
    auto * data = stbi_load(fname, &nx, &ny, &nc, 3);
    if (!data) {
        LOG_ERR("%s: failed to load image '%s'\n", __func__, fname);
        return false;
    }
    clip_build_img_from_pixels(data, nx, ny, img);
    stbi_image_free(data);
    return true;
}